

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChVisualMaterial.cpp
# Opt level: O2

void __thiscall chrono::ChVisualMaterial::ChVisualMaterial(ChVisualMaterial *this)

{
  undefined8 uVar1;
  
  (this->Ka).R = 0.2;
  (this->Ka).G = 0.2;
  *(undefined8 *)&(this->Ka).B = 0x3f8000003e4ccccd;
  (this->Kd).G = 1.0;
  (this->Kd).B = 1.0;
  (this->Ks).R = 0.2;
  (this->Ks).G = 0.2;
  *(undefined8 *)&(this->Ks).B = 0x3e4ccccd;
  (this->Ke).G = 0.0;
  (this->Ke).B = 0.0;
  this->fresnel_max = 1.0;
  this->fresnel_min = 0.0;
  this->fresnel_exp = 5.0;
  this->Ns = 88.0;
  this->d = 1.0;
  this->illum = 0;
  uVar1 = vmovlps_avx(SUB6416(ZEXT464(0x3f800000),0));
  this->roughness = (float)(int)uVar1;
  this->metallic = (float)(int)((ulong)uVar1 >> 0x20);
  this->use_specular_workflow = true;
  ChTexture::ChTexture(&this->kd_texture);
  ChTexture::ChTexture(&this->ks_texture);
  ChTexture::ChTexture(&this->normal_texture);
  ChTexture::ChTexture(&this->metallic_texture);
  ChTexture::ChTexture(&this->roughness_texture);
  ChTexture::ChTexture(&this->opacity_texture);
  this->class_id = 0;
  this->instance_id = 0;
  return;
}

Assistant:

ChVisualMaterial::ChVisualMaterial()
    : Ka({0.2f, 0.2f, 0.2f}),
      Kd({1.0f, 1.0f, 1.0f}),
      Ks({0.2f, 0.2f, 0.2f}),
      Ke({0.0f, 0.0f, 0.0f}),
      Ns(88),
      d(1),
      fresnel_exp(5),
      fresnel_max(1),
      fresnel_min(0.f),
      illum(0),
      roughness(1),
      metallic(0),
      use_specular_workflow(true),
      class_id(0),
      instance_id(0) {}